

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O2

bool __thiscall icu_63::SpoofImpl::isIllegalCombiningDotLeadCharacter(SpoofImpl *this,UChar32 cp)

{
  bool bVar1;
  int32_t offset;
  UChar32 cp_00;
  bool bVar2;
  UnicodeString skelStr;
  
  bVar1 = isIllegalCombiningDotLeadCharacterNoLookup(cp);
  if (bVar1) {
    return true;
  }
  skelStr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003edbf0;
  skelStr.fUnion.fStackFields.fLengthAndFlags = 2;
  SpoofData::confusableLookup(this->fSpoofData,cp,&skelStr);
  if (-1 < skelStr.fUnion.fStackFields.fLengthAndFlags) {
    skelStr.fUnion.fFields.fLength = (int)skelStr.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  offset = UnicodeString::moveIndex32(&skelStr,skelStr.fUnion.fFields.fLength,-1);
  cp_00 = UnicodeString::char32At(&skelStr,offset);
  if (cp_00 != cp) {
    bVar1 = isIllegalCombiningDotLeadCharacterNoLookup(cp_00);
    bVar2 = true;
    if (bVar1) goto LAB_001f92f7;
  }
  bVar2 = false;
LAB_001f92f7:
  UnicodeString::~UnicodeString(&skelStr);
  return bVar2;
}

Assistant:

bool SpoofImpl::isIllegalCombiningDotLeadCharacter(UChar32 cp) const {
    if (isIllegalCombiningDotLeadCharacterNoLookup(cp)) {
        return true;
    }
    UnicodeString skelStr;
    fSpoofData->confusableLookup(cp, skelStr);
    UChar32 finalCp = skelStr.char32At(skelStr.moveIndex32(skelStr.length(), -1));
    if (finalCp != cp && isIllegalCombiningDotLeadCharacterNoLookup(finalCp)) {
        return true;
    }
    return false;
}